

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::ArrayBuilder<capnp::Schema>::~ArrayBuilder(ArrayBuilder<capnp::Schema> *this)

{
  Schema *pSVar1;
  RemoveConst<capnp::Schema> *pRVar2;
  Schema *pSVar3;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (Schema *)0x0) {
    pRVar2 = this->pos;
    pSVar3 = this->endPtr;
    this->ptr = (Schema *)0x0;
    this->pos = (RemoveConst<capnp::Schema> *)0x0;
    this->endPtr = (Schema *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pSVar1,8,(long)pRVar2 - (long)pSVar1 >> 3,
               (long)pSVar3 - (long)pSVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }